

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode cr_mime_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  CURLcode CVar2;
  size_t sVar3;
  size_t nitems;
  long lVar4;
  char scratch [4096];
  
  if (offset < 1) {
    return CURLE_OK;
  }
  pvVar1 = reader->ctx;
  lVar4 = 0;
  while( true ) {
    nitems = 0x1000;
    if (offset - lVar4 < 0x1001) {
      nitems = curlx_sotouz(offset - lVar4);
    }
    sVar3 = Curl_mime_read(scratch,(size_t)reader,nitems,*(void **)((long)pvVar1 + 0x20));
    lVar4 = lVar4 + sVar3;
    if (nitems <= sVar3 - 1) break;
    if (offset <= lVar4) {
      lVar4 = *(long *)((long)pvVar1 + 0x28);
      CVar2 = CURLE_OK;
      if ((0 < lVar4) &&
         (*(long *)((long)pvVar1 + 0x28) = lVar4 - offset, lVar4 - offset == 0 || lVar4 < offset)) {
        Curl_failf(data,"Mime post already completely uploaded");
        CVar2 = CURLE_PARTIAL_FILE;
      }
      return CVar2;
    }
  }
  Curl_failf(data,"Could only read %ld bytes from the mime post",lVar4);
  return CURLE_READ_ERROR;
}

Assistant:

static CURLcode cr_mime_resume_from(struct Curl_easy *data,
                                    struct Curl_creader *reader,
                                    curl_off_t offset)
{
  struct cr_mime_ctx *ctx = reader->ctx;

  if(offset > 0) {
    curl_off_t passed = 0;

    do {
      char scratch[4*1024];
      size_t readthisamountnow =
        (offset - passed > (curl_off_t)sizeof(scratch)) ?
        sizeof(scratch) :
        curlx_sotouz(offset - passed);
      size_t nread;

      nread = Curl_mime_read(scratch, 1, readthisamountnow, ctx->part);
      passed += (curl_off_t)nread;
      if((nread == 0) || (nread > readthisamountnow)) {
        /* this checks for greater-than only to make sure that the
           CURL_READFUNC_ABORT return code still aborts */
        failf(data, "Could only read %" FMT_OFF_T
              " bytes from the mime post", passed);
        return CURLE_READ_ERROR;
      }
    } while(passed < offset);

    /* now, decrease the size of the read */
    if(ctx->total_len > 0) {
      ctx->total_len -= offset;

      if(ctx->total_len <= 0) {
        failf(data, "Mime post already completely uploaded");
        return CURLE_PARTIAL_FILE;
      }
    }
    /* we have passed, proceed as normal */
  }
  return CURLE_OK;
}